

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O2

void __thiscall timer::canceler::operator()(canceler *this,error_code *e)

{
  ostream *poVar1;
  
  if (e->_M_value != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar1 = std::operator<<(poVar1,"!e");
    poVar1 = std::operator<<(poVar1," at ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x70);
    std::endl<char,std::char_traits<char>>(poVar1);
    return_code = 1;
  }
  booster::aio::io_service::cancel_timer_event((int)this->srv);
  return;
}

Assistant:

void operator()(booster::system::error_code const &e) const
		{
			TEST(!e);
			srv->cancel_timer_event(event_id);
		}